

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void free_dfg(CManager cm,void *vdfg)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < *(int *)((long)vdfg + 0x10); lVar1 = lVar1 + 1) {
    free(*(void **)((long)*(void **)((long)vdfg + 0x18) + lVar1 * 8));
  }
  free(*(void **)((long)vdfg + 0x18));
  if (*(EVdfg_configuration *)((long)vdfg + 0x30) != (EVdfg_configuration)0x0) {
    free_dfg_state(*(EVdfg_configuration *)((long)vdfg + 0x30));
  }
  if (*(EVdfg_configuration *)((long)vdfg + 0x38) != (EVdfg_configuration)0x0) {
    free_dfg_state(*(EVdfg_configuration *)((long)vdfg + 0x38));
  }
  free(vdfg);
  return;
}

Assistant:

static void
free_dfg(CManager cm, void *vdfg)
{
    EVdfg dfg = vdfg;
    int i;
    for (i=0; i < dfg->stone_count; i++) {
	if (dfg->stones[i]) free(dfg->stones[i]);
    }
    if (dfg->stones) free(dfg->stones);
    if (dfg->deployed_state) free_dfg_state(dfg->deployed_state);
    if (dfg->working_state) free_dfg_state(dfg->working_state);
    free(dfg);
}